

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pMVar3;
  pointer pMVar4;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar5;
  pointer pcVar6;
  byte bVar7;
  double dVar8;
  undefined8 uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  uint uVar14;
  _Base_ptr p_Var15;
  char *__s;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  IVal *pIVar19;
  long lVar20;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  long lVar22;
  Matrix<float,_3,_2> *val;
  IVal *pIVar23;
  PrecisionCase *pPVar24;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *pVVar25;
  byte bVar26;
  FloatFormat *fmt;
  IVal in2;
  IVal in3;
  ostringstream os;
  IVal in1;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  outputs;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined1 auStack_5f8 [8];
  PrecisionCase *local_5f0;
  string local_5e8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  *local_5c8;
  size_t local_5c0;
  Statement *local_5b8;
  long local_5b0;
  ulong local_5a8;
  string local_5a0;
  ulong local_580;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_578;
  FloatFormat *local_570;
  ResultCollector *local_568;
  long local_560;
  undefined1 local_558 [8];
  pointer pVStack_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  double local_538;
  Data local_530;
  undefined4 local_520;
  double adStack_510 [5];
  ios_base local_4e8 [8];
  ios_base local_4e0 [264];
  undefined1 local_3d8 [144];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_348;
  FloatFormat local_318;
  ulong local_2e8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  local_2e0;
  undefined1 local_2b0 [56];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  _Base_ptr local_228 [3];
  double local_210;
  IVal local_1f0;
  undefined1 local_1a8 [72];
  undefined1 local_160 [304];
  
  pMVar3 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_5c0 = ((long)pMVar4 - (long)pMVar3 >> 3) * -0x5555555555555555;
  local_5c8 = variables;
  local_5b8 = stmt;
  local_578 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  ::Outputs(&local_2e0,local_5c0);
  local_278._M_p = (pointer)&local_268;
  local_2b0._0_4_ = GLSL_VERSION_300_ES;
  local_2b0._8_8_ = (pointer)0x0;
  local_2b0._16_8_ = (pointer)0x0;
  local_2b0._24_8_ = (pointer)0x0;
  local_2b0._32_8_ = (pointer)0x0;
  local_2b0._40_8_ = (pointer)0x0;
  local_2b0._48_8_ = (pointer)0x0;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_258._M_p = (pointer)&local_248;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_558 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"Statement: ",0xb);
  (*local_5b8->_vptr_Statement[2])(local_5b8,(ostringstream *)&pVStack_550);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_5f0 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_550);
  std::ios_base::~ios_base(local_4e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_238 + 8);
  local_238._8_4_ = _S_red;
  local_228[0] = (_Base_ptr)0x0;
  local_210 = 0.0;
  local_228[1] = p_Var2;
  local_228[2] = p_Var2;
  (*local_5b8->_vptr_Statement[4])(local_5b8,local_238);
  if (local_228[1] != p_Var2) {
    p_Var15 = local_228[1];
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  pPVar24 = local_5f0;
  if (local_210 != 0.0) {
    local_558 = (undefined1  [8])((local_5f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_550,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_550,(char *)local_3d8._0_8_,local_3d8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_3d8._0_8_ != (IVal *)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_550);
    std::ios_base::~ios_base(local_4e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_160 + 0x28));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,"precision ",10);
  __s = glu::getPrecisionName((pPVar24->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_5f8 + *(long *)((long)local_558 + -0x18)) + 0xa0);
  }
  else {
    sVar16 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,__s,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_278,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
  std::ios_base::~ios_base(local_4e8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_5f0->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar25 = local_5c8;
  local_2b0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_5f0->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_5f0->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar21) {
      local_548._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_548._8_8_ = plVar17[3];
      local_558 = (undefined1  [8])&local_548;
    }
    else {
      local_548._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_558 = (undefined1  [8])*plVar17;
    }
    pVStack_550 = (pointer)plVar17[1];
    *plVar17 = (long)paVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_278,(string *)local_558);
    if (local_558 != (undefined1  [8])&local_548) {
      operator_delete((void *)local_558,local_548._M_allocated_capacity + 1);
    }
    pVVar25 = local_5c8;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2b0 + 8),1);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_558,local_5f0,
             (pVVar25->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar9 = local_2b0._8_8_;
  std::__cxx11::string::operator=((string *)local_2b0._8_8_,(string *)local_558);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_538);
  glu::VarType::~VarType((VarType *)&local_538);
  if (local_558 != (undefined1  [8])&local_548) {
    operator_delete((void *)local_558,local_548._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2b0 + 0x20),2);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_558,local_5f0,
             (local_5c8->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar9 = local_2b0._32_8_;
  std::__cxx11::string::operator=((string *)(local_2b0._32_8_ + 0x38),(string *)local_558);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&local_538);
  glu::VarType::~VarType((VarType *)&local_538);
  pVVar25 = local_5c8;
  if (local_558 != (undefined1  [8])&local_548) {
    operator_delete((void *)local_558,local_548._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_558,local_5f0,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar9 = local_2b0._32_8_;
  std::__cxx11::string::operator=((string *)local_2b0._32_8_,(string *)local_558);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_538);
  glu::VarType::~VarType((VarType *)&local_538);
  if (local_558 != (undefined1  [8])&local_548) {
    operator_delete((void *)local_558,local_548._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
  (*local_5b8->_vptr_Statement[2])(local_5b8,local_558);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
  std::ios_base::~ios_base(local_4e8);
  std::__cxx11::string::operator=((string *)&local_258,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar24 = local_5f0;
  pSVar18 = ShaderExecUtil::createExecutor
                      ((local_5f0->m_ctx).renderContext,(local_5f0->m_ctx).shaderType,
                       (ShaderSpec *)local_2b0);
  local_558 = (undefined1  [8])
              (local_578->in0).
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_550 = (local_578->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_548._M_allocated_capacity =
       (size_type)
       (local_578->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_548._8_8_ =
       (local_578->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2e0.out0.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2e0.out1.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,local_5c0,local_558);
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_558);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
  pVVar25 = local_5c8;
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_238);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_348,
             (pVVar25->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_558);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_348,
             (pVVar25->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_3d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_348,
             (pVVar25->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5e8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_348,
             (pVVar25->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5a0);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_348,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_348,
             (pVVar25->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_238);
  if (pMVar4 == pMVar3) {
LAB_0174b6a8:
    local_558 = (undefined1  [8])((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_550);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_550," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(pPVar24->m_ctx).floatFormat;
    local_568 = &pPVar24->m_status;
    local_2e8 = local_5c0 + (local_5c0 == 0);
    local_5a8 = 0;
    local_560 = 0xc;
    local_580 = 0;
    local_570 = fmt;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_238);
      if ((local_5a8 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_5f0->super_TestCase).super_TestNode.m_testCtx);
      }
      pMVar3 = (local_578->in0).
               super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5e8._M_dataplus._M_p = (char *)0x0;
      local_5e8._M_string_length = 0;
      local_5e8.field_2._M_allocated_capacity = 0;
      lVar22 = 0;
      do {
        *(undefined4 *)((long)&local_5e8._M_dataplus._M_p + lVar22 * 4) =
             *(undefined4 *)((long)((pMVar3->m_data).m_data + -1) + lVar22 * 4 + local_560);
        *(undefined4 *)((long)&local_5e8._M_string_length + lVar22 * 4 + 4) =
             *(undefined4 *)((long)(pMVar3->m_data).m_data[0].m_data + lVar22 * 4 + local_560);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doRound
                ((IVal *)local_3d8,fmt,(Matrix<float,_3,_2> *)&local_5e8);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_558,fmt,(IVal *)local_3d8);
      pIVar19 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_348,
                           (pVVar25->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      lVar22 = 0;
      do {
        *(undefined8 *)((long)&(pIVar19->m_data).m_data[0].m_data[0].m_hi + lVar22) =
             *(undefined8 *)((long)&local_548 + lVar22);
        dVar8 = *(double *)((long)&pVStack_550 + lVar22);
        pbVar1 = &(pIVar19->m_data).m_data[0].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar1 = *(undefined8 *)(local_558 + lVar22);
        *(double *)(pbVar1 + 8) = dVar8;
        dVar8 = *(double *)((long)adStack_510 + lVar22 + 8);
        pbVar1 = &(pIVar19->m_data).m_data[1].m_data[0].m_hasNaN + lVar22;
        *(undefined8 *)pbVar1 = *(undefined8 *)((long)adStack_510 + lVar22);
        *(double *)(pbVar1 + 8) = dVar8;
        *(undefined8 *)((long)&(pIVar19->m_data).m_data[1].m_data[0].m_hi + lVar22) =
             *(undefined8 *)((long)adStack_510 + lVar22 + 0x10);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x48);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_348,
                 (pVVar25->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_348,
                 (pVVar25->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_348,
                 (pVVar25->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_530.basic.type = (local_5f0->m_ctx).precision;
      local_538 = fmt->m_maxValue;
      local_558 = *(undefined1 (*) [8])fmt;
      pVStack_550 = *(pointer *)&fmt->m_fractionBits;
      local_548._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_548._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_520 = 0;
      local_530._8_8_ = &local_348;
      (*local_5b8->_vptr_Statement[3])(local_5b8,local_558);
      pIVar19 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_348,
                           (pVVar25->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_558,&local_318,pIVar19);
      pMVar3 = local_2e0.out1.
               super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = local_5a8;
      lVar22 = 0;
      do {
        *(undefined8 *)((long)local_228 + lVar22) = *(undefined8 *)((long)&local_548 + lVar22);
        *(undefined8 *)(local_238 + lVar22) = *(undefined8 *)(local_558 + lVar22);
        *(undefined8 *)(local_238 + lVar22 + 8) = *(undefined8 *)((long)&pVStack_550 + lVar22);
        uVar9 = *(undefined8 *)((long)adStack_510 + lVar22 + 8);
        *(undefined8 *)(&local_1f0.m_data[0].m_hasNaN + lVar22) =
             *(undefined8 *)((long)adStack_510 + lVar22);
        *(undefined8 *)((long)&local_1f0.m_data[0].m_lo + lVar22) = uVar9;
        *(undefined8 *)((long)&local_1f0.m_data[0].m_hi + lVar22) =
             *(undefined8 *)((long)adStack_510 + lVar22 + 0x10);
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x48);
      local_5b0 = local_5a8 * 0x18;
      bVar26 = 1;
      lVar22 = 0;
      pIVar23 = (IVal *)local_238;
      do {
        bVar11 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (pIVar23,pMVar3[uVar10].m_data.m_data + lVar22);
        lVar22 = 1;
        bVar7 = bVar26 & bVar11;
        bVar26 = 0;
        pIVar23 = &local_1f0;
      } while (bVar7 != 0);
      local_558 = (undefined1  [8])&local_548;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_568,bVar11,(string *)local_558);
      if (local_558 != (undefined1  [8])&local_548) {
        operator_delete((void *)local_558,(ulong)(local_548._M_allocated_capacity + 1));
      }
      pIVar19 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_348,
                           (pVVar25->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_558,&local_318,pIVar19);
      pMVar3 = local_2e0.out0.
               super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = local_5b0;
      lVar20 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar20 + 0x10) = *(undefined8 *)((long)&local_548 + lVar20);
        *(undefined8 *)(local_1a8 + lVar20) = *(undefined8 *)(local_558 + lVar20);
        *(undefined8 *)(local_1a8 + lVar20 + 8) = *(undefined8 *)((long)&pVStack_550 + lVar20);
        uVar9 = *(undefined8 *)((long)adStack_510 + lVar20 + 8);
        *(undefined8 *)(local_160 + lVar20) = *(undefined8 *)((long)adStack_510 + lVar20);
        *(undefined8 *)(local_160 + lVar20 + 8) = uVar9;
        *(undefined8 *)(local_160 + lVar20 + 0x10) =
             *(undefined8 *)((long)adStack_510 + lVar20 + 0x10);
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x48);
      bVar26 = 1;
      lVar20 = 0;
      pIVar23 = (IVal *)local_1a8;
      do {
        bVar12 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (pIVar23,(Vector<float,_3> *)
                                    ((long)(pMVar3->m_data).m_data[lVar20].m_data + lVar22));
        lVar20 = 1;
        bVar7 = bVar26 & bVar12;
        bVar26 = 0;
        pIVar23 = (IVal *)local_160;
      } while (bVar7 != 0);
      local_558 = (undefined1  [8])&local_548;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_568,bVar12,(string *)local_558);
      fmt = local_570;
      pVVar25 = local_5c8;
      if (local_558 != (undefined1  [8])&local_548) {
        operator_delete((void *)local_558,(ulong)(local_548._M_allocated_capacity + 1));
      }
      if (!bVar11 || !bVar12) {
        uVar14 = (int)local_580 + 1;
        local_580 = (ulong)uVar14;
        fmt = local_570;
        if ((int)uVar14 < 0x65) {
          local_558 = (undefined1  [8])((local_5f0->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\t",1);
          pVVar5 = (pVVar25->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                   .m_ptr;
          val = (Matrix<float,_3,_2> *)(local_3d8 + 0x10);
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3d8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,(char *)local_3d8._0_8_,local_3d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    (&local_5e8,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((long)(((local_578->in0).
                              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_5b0),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
            operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_3,_2> *)local_3d8._0_8_ != (Matrix<float,_3,_2> *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\t",1);
          pVVar5 = (pVVar25->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                   .m_ptr;
          pIVar19 = (IVal *)(local_3d8 + 0x10);
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3d8._0_8_ = pIVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,(char *)local_3d8._0_8_,local_3d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    (&local_5e8,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((long)((local_2e0.out0.
                              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_5b0),(Matrix<float,_3,_2> *)pIVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,2>>
                    (&local_5a0,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_1a8,pIVar19
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
            operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
            operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3d8._0_8_ != (IVal *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\t",1);
          pVVar5 = (pVVar25->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                   .m_ptr;
          pIVar19 = (IVal *)(local_3d8 + 0x10);
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3d8._0_8_ = pIVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,(char *)local_3d8._0_8_,local_3d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    (&local_5e8,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((long)((local_2e0.out1.
                              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_5b0),(Matrix<float,_3,_2> *)pIVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,2>>
                    (&local_5a0,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_238,pIVar19
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_550,local_5a0._M_dataplus._M_p,local_5a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
            operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
            operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3d8._0_8_ != (IVal *)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_550);
          std::ios_base::~ios_base(local_4e0);
          fmt = local_570;
        }
      }
      pPVar24 = local_5f0;
      local_5a8 = local_5a8 + 1;
      local_560 = local_560 + 0x18;
    } while (local_5a8 != local_2e8);
    iVar13 = (int)local_580;
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_0174b6a8;
    }
    else {
      local_558 = (undefined1  [8])((local_5f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_550,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_550);
      std::ios_base::~ios_base(local_4e0);
    }
    local_558 = (undefined1  [8])((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_550);
    std::ostream::operator<<((ostringstream *)&pVStack_550,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_550,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_550);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_550," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_550);
  std::ios_base::~ios_base(local_4e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,
                    CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p,
                    CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2b0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2b0 + 8));
  if (local_2e0.out1.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}